

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

bool __thiscall QUrlModel::setData(QUrlModel *this,QModelIndex *index,QVariant *value,int role)

{
  QFileSystemModel *pQVar1;
  undefined1 uVar2;
  int iVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_c8;
  QArrayDataPointer<char16_t> local_b0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QUrl url;
  QVariant local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = ::QVariant::typeId(value);
  if (iVar3 == 0x11) {
    url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toUrl();
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = this->fileSystemModel;
    QUrl::toLocalFile();
    QFileSystemModel::index((QString *)&local_98,(int)pQVar1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    if (this->showFullPath == true) {
      (**(code **)(*(long *)this->fileSystemModel + 0x90))
                (&local_78,this->fileSystemModel,&local_98,0x101);
      ::QVariant::toString();
      QDir::toNativeSeparators((QString *)&local_b0);
      ::QVariant::QVariant(&local_58,(QString *)&local_b0);
      QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)&local_58);
      ::QVariant::~QVariant(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_c8);
    }
    else {
      (**(code **)(*(long *)this->fileSystemModel + 0x90))
                (&local_78,this->fileSystemModel,&local_98,0x101);
      ::QVariant::toString();
      QDir::toNativeSeparators((QString *)&local_b0);
      ::QVariant::QVariant(&local_58,(QString *)&local_b0);
      QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)&local_58);
      ::QVariant::~QVariant(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_c8);
      ::QVariant::~QVariant(&local_78);
      (**(code **)(*(long *)this->fileSystemModel + 0x90))
                (&local_78,this->fileSystemModel,&local_98,0);
      ::QVariant::toString();
      ::QVariant::QVariant(&local_58,(QString *)&local_b0);
      QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)&local_58);
      ::QVariant::~QVariant(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    }
    ::QVariant::~QVariant(&local_78);
    (**(code **)(*(long *)this->fileSystemModel + 0x90))
              (&local_58,this->fileSystemModel,&local_98,1);
    QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)&local_58);
    ::QVariant::~QVariant(&local_58);
    ::QVariant::QVariant(&local_58,&url);
    QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)&local_58);
    ::QVariant::~QVariant(&local_58);
    QUrl::~QUrl(&url);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return true;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar2 = QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)value);
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QUrlModel::setData(const QModelIndex &index, const QVariant &value, int role)
{
    if (value.userType() == QMetaType::QUrl) {
        QUrl url = value.toUrl();
        QModelIndex dirIndex = fileSystemModel->index(url.toLocalFile());
        //On windows the popup display the "C:\", convert to nativeSeparators
        if (showFullPath)
            QStandardItemModel::setData(index, QDir::toNativeSeparators(fileSystemModel->data(dirIndex, QFileSystemModel::FilePathRole).toString()));
        else {
            QStandardItemModel::setData(index, QDir::toNativeSeparators(fileSystemModel->data(dirIndex, QFileSystemModel::FilePathRole).toString()), Qt::ToolTipRole);
            QStandardItemModel::setData(index, fileSystemModel->data(dirIndex).toString());
        }
        QStandardItemModel::setData(index, fileSystemModel->data(dirIndex, Qt::DecorationRole),
                                               Qt::DecorationRole);
        QStandardItemModel::setData(index, url, UrlRole);
        return true;
    }
    return QStandardItemModel::setData(index, value, role);
}